

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void pugi::impl::(anonymous_namespace)::
     sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
               (xpath_node *begin,xpath_node *end,document_order_comparator *pred)

{
  undefined8 uVar1;
  xml_attribute_struct *pxVar2;
  undefined1 auVar3 [16];
  xpath_node *pxVar4;
  bool bVar5;
  xpath_node *rhs;
  xpath_node *rhs_00;
  xpath_node *extraout_RDX;
  xpath_node *pxVar6;
  xpath_node *extraout_RDX_00;
  xpath_node *extraout_RDX_01;
  xpath_node *extraout_RDX_02;
  xpath_node *extraout_RDX_03;
  xpath_node *pxVar7;
  xpath_node *pxVar8;
  ulong uVar9;
  xpath_node *pxVar10;
  xpath_node val;
  xml_node_struct *local_68;
  xml_attribute_struct *pxStack_60;
  xpath_node *local_58;
  xpath_node *local_50;
  xpath_node local_48;
  
  uVar9 = (long)end - (long)begin >> 4;
  if (0x10 < (long)uVar9) {
    pxVar10 = begin;
    do {
      pxVar8 = pxVar10 + (uVar9 >> 1);
      local_50 = end;
      bVar5 = anon_unknown_0::document_order_comparator::operator()
                        ((document_order_comparator *)pxVar8,pxVar10,(xpath_node *)pred);
      pxVar7 = pxVar8;
      pxVar6 = pxVar10;
      if (bVar5) {
        pxVar7 = pxVar10;
        pxVar6 = pxVar8;
      }
      bVar5 = anon_unknown_0::document_order_comparator::operator()
                        ((document_order_comparator *)(end + -1),pxVar7,rhs);
      if (bVar5) {
        pxVar7 = end + -1;
      }
      bVar5 = anon_unknown_0::document_order_comparator::operator()
                        ((document_order_comparator *)pxVar7,pxVar6,rhs_00);
      if (bVar5) {
        pxVar7 = pxVar6;
      }
      local_48._node._root = (pxVar7->_node)._root;
      local_48._attribute._attr = (pxVar7->_attribute)._attr;
      pxVar6 = extraout_RDX;
      pxVar7 = pxVar10;
      pxVar8 = pxVar10;
      begin = end;
      local_58 = end;
      if (pxVar10 < end) {
        do {
          bVar5 = anon_unknown_0::document_order_comparator::operator()
                            ((document_order_comparator *)pxVar8,&local_48,pxVar6);
          if (bVar5) {
            pxVar8 = pxVar8 + 1;
          }
          else {
            auVar3._8_8_ = local_48._attribute._attr;
            auVar3._0_8_ = local_48._node._root;
            uVar1 = vpcmpeqq_avx512vl(auVar3,(undefined1  [16])*pxVar8);
            if (((byte)uVar1 & 3) == 3) {
              local_68 = (pxVar7->_node)._root;
              pxStack_60 = (pxVar7->_attribute)._attr;
              pxVar2 = (pxVar8->_attribute)._attr;
              (pxVar7->_node)._root = (pxVar8->_node)._root;
              (pxVar7->_attribute)._attr = pxVar2;
              pxVar7 = pxVar7 + 1;
              (pxVar8->_node)._root = local_68;
              (pxVar8->_attribute)._attr = pxStack_60;
              pxVar8 = pxVar8 + 1;
            }
            else {
              local_68 = (pxVar8->_node)._root;
              pxStack_60 = (pxVar8->_attribute)._attr;
              pxVar2 = begin[-1]._attribute._attr;
              (pxVar8->_node)._root = begin[-1]._node._root;
              (pxVar8->_attribute)._attr = pxVar2;
              begin[-1]._node._root = local_68;
              begin[-1]._attribute._attr = pxStack_60;
              begin = begin + -1;
            }
          }
          pxVar6 = extraout_RDX_00;
          end = begin;
          pxVar4 = pxVar10;
        } while (pxVar8 < begin);
        for (; pxVar7 != pxVar4; pxVar4 = pxVar4 + 1) {
          local_68 = (pxVar4->_node)._root;
          pxStack_60 = (pxVar4->_attribute)._attr;
          pxVar2 = end[-1]._attribute._attr;
          (pxVar4->_node)._root = end[-1]._node._root;
          (pxVar4->_attribute)._attr = pxVar2;
          end[-1]._node._root = local_68;
          end[-1]._attribute._attr = pxStack_60;
          end = end + -1;
        }
      }
      if ((long)local_50 - (long)begin < (long)end - (long)pxVar10) {
        sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                  (begin,local_58,(document_order_comparator *)pxVar6);
        pred = (document_order_comparator *)extraout_RDX_01;
        begin = pxVar10;
      }
      else {
        sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                  (pxVar10,end,(document_order_comparator *)pxVar6);
        pred = (document_order_comparator *)extraout_RDX_02;
        end = local_58;
      }
      uVar9 = (long)end - (long)begin >> 4;
      pxVar10 = begin;
    } while (0x10 < (long)uVar9);
  }
  pxVar10 = begin + 1;
  if (pxVar10 != end && begin != end) {
    do {
      local_68 = (pxVar10->_node)._root;
      pxStack_60 = (pxVar10->_attribute)._attr;
      pxVar6 = pxVar10;
      while (begin < pxVar6) {
        pxVar7 = pxVar6 + -1;
        bVar5 = anon_unknown_0::document_order_comparator::operator()
                          ((document_order_comparator *)&local_68,pxVar7,(xpath_node *)pred);
        pred = (document_order_comparator *)extraout_RDX_03;
        if (!bVar5) break;
        pxVar2 = pxVar6[-1]._attribute._attr;
        (pxVar6->_node)._root = (pxVar7->_node)._root;
        (pxVar6->_attribute)._attr = pxVar2;
        pxVar6 = pxVar7;
      }
      pxVar10 = pxVar10 + 1;
      (pxVar6->_node)._root = local_68;
      (pxVar6->_attribute)._attr = pxStack_60;
    } while (pxVar10 != end);
  }
  return;
}

Assistant:

PUGI__FN void sort(I begin, I end, const Pred& pred)
	{
		// sort large chunks
		while (end - begin > 16)
		{
			// find median element
			I middle = begin + (end - begin) / 2;
			I median = median3(begin, middle, end - 1, pred);

			// partition in three chunks (< = >)
			I eqbeg, eqend;
			partition3(begin, end, *median, pred, &eqbeg, &eqend);

			// loop on larger half
			if (eqbeg - begin > end - eqend)
			{
				sort(eqend, end, pred);
				end = eqbeg;
			}
			else
			{
				sort(begin, eqbeg, pred);
				begin = eqend;
			}
		}

		// insertion sort small chunk
		insertion_sort(begin, end, pred);
	}